

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

bool __thiscall mpt::message_store::set_ignore_level(message_store *this,int val)

{
  if (val < 0) {
    val = 0x10;
  }
  else if (0x1f < (uint)val) {
    return false;
  }
  this->_ignore = (uint8_t)val;
  return true;
}

Assistant:

bool message_store::set_ignore_level(int val)
{
	if (val < 0) {
		val = Debug;
	}
	else if (val >= File) {
		return false;
	}
	_ignore = val;
	return true;
}